

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cpp
# Opt level: O1

void __thiscall bitboards::printStandardArrayBoard(bitboards *this)

{
  int iVar1;
  long lVar2;
  int y;
  int iVar3;
  char array [64];
  char local_79;
  char local_78 [72];
  
  builtin_strncpy(local_78 + 0x30,"                ",0x10);
  builtin_strncpy(local_78 + 0x20,"                ",0x10);
  builtin_strncpy(local_78 + 0x10,"                ",0x10);
  builtin_strncpy(local_78,"                ",0x10);
  convertToStandardArray(this,local_78);
  iVar3 = 0;
  iVar1 = 0;
  do {
    lVar2 = 0;
    do {
      local_79 = local_78[lVar2 + iVar1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_79,1);
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 8);
    iVar1 = iVar1 + 8;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar3 = iVar3 + 1;
  } while (iVar3 != 8);
  return;
}

Assistant:

void bitboards::printStandardArrayBoard() {
  char array[64];
  for (int i=0; i < 64; i++) {
    array[i] = ' ';
  }

  convertToStandardArray(array);

  int i = 0;
  for(int y = 0; y < 8; y++) {
    for(int x = 0; x < 8; x++, i++) {
      std::cout << array[i];
    }
    std::cout << std::endl;
  }
}